

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverAddCubeTail_(Mvc_Cover_t *pCover,Mvc_Cube_t *pCube)

{
  Mvc_List_t *pList;
  Mvc_Cube_t *pCube_local;
  Mvc_Cover_t *pCover_local;
  
  if ((pCover->lCubes).pHead == (Mvc_Cube_t *)0x0) {
    (pCover->lCubes).pHead = pCube;
  }
  else {
    ((pCover->lCubes).pTail)->pNext = pCube;
  }
  (pCover->lCubes).pTail = pCube;
  pCube->pNext = (Mvc_Cube_t *)0x0;
  (pCover->lCubes).nItems = (pCover->lCubes).nItems + 1;
  return;
}

Assistant:

void Mvc_CoverAddCubeTail_( Mvc_Cover_t * pCover, Mvc_Cube_t * pCube )
{
    Mvc_List_t * pList = &pCover->lCubes;

    if ( pList->pHead == NULL )
        pList->pHead = pCube;
    else
        Mvc_CubeSetNext( pList->pTail, pCube );
    pList->pTail    = pCube;
    Mvc_CubeSetNext( pCube, NULL );
    pList->nItems++;
}